

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<ProStringList>::emplace<ProStringList_const&>
          (QMovableArrayOps<ProStringList> *this,qsizetype i,ProStringList *args)

{
  qsizetype *pqVar1;
  ProStringList **ppPVar2;
  ProStringList *pPVar3;
  Data *pDVar4;
  long lVar5;
  ProStringList *pPVar6;
  Data *pDVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QArrayDataPointer<ProString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002874be:
    local_48.d = (args->super_QList<ProString>).d.d;
    local_48.ptr = (args->super_QList<ProString>).d.ptr;
    local_48.size = (args->super_QList<ProString>).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar8 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
            size != 0;
    QArrayDataPointer<ProStringList>::detachAndGrow
              ((QArrayDataPointer<ProStringList> *)this,(uint)(i == 0 && bVar8),1,
               (ProStringList **)0x0,(QArrayDataPointer<ProStringList> *)0x0);
    pPVar6 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
             ptr;
    if (i == 0 && bVar8) {
      pPVar6[-1].super_QList<ProString>.d.d = local_48.d;
      pPVar6[-1].super_QList<ProString>.d.ptr = local_48.ptr;
      pPVar6[-1].super_QList<ProString>.d.size = local_48.size;
      (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.ptr =
           pPVar6 + -1;
    }
    else {
      pPVar3 = pPVar6 + i;
      memmove(pPVar3 + 1,pPVar6 + i,
              ((this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
               size - i) * 0x18);
      (pPVar3->super_QList<ProString>).d.d = local_48.d;
      (pPVar3->super_QList<ProString>).d.ptr = local_48.ptr;
      (pPVar3->super_QList<ProString>).d.size = local_48.size;
    }
    local_48.size = 0;
    local_48.ptr = (ProString *)0x0;
    local_48.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
              size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_48);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
            size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<ProStringList>).
                      super_QArrayDataPointer<ProStringList>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      pPVar6 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
               ptr;
      pDVar7 = (args->super_QList<ProString>).d.d;
      pPVar6[lVar5].super_QList<ProString>.d.d = pDVar7;
      pPVar6[lVar5].super_QList<ProString>.d.ptr = (args->super_QList<ProString>).d.ptr;
      pPVar6[lVar5].super_QList<ProString>.d.size = (args->super_QList<ProString>).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((ProStringList *)
          ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.ptr))
      goto LAB_002874be;
      pPVar6 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
               ptr;
      pDVar7 = (args->super_QList<ProString>).d.d;
      pPVar6[-1].super_QList<ProString>.d.d = pDVar7;
      pPVar6[-1].super_QList<ProString>.d.ptr = (args->super_QList<ProString>).d.ptr;
      pPVar6[-1].super_QList<ProString>.d.size = (args->super_QList<ProString>).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      ppPVar2 = &(this->super_QGenericArrayOps<ProStringList>).
                 super_QArrayDataPointer<ProStringList>.ptr;
      *ppPVar2 = *ppPVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
              size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }